

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall cmGlobalGenerator::Configure(cmGlobalGenerator *this)

{
  pointer *pppcVar1;
  cmake *pcVar2;
  iterator __position;
  cmMakefile *pcVar3;
  undefined *puVar4;
  bool bVar5;
  int iVar6;
  undefined4 extraout_var;
  char *pcVar7;
  ostream *poVar8;
  undefined **ppuVar9;
  cmLocalGenerator *lg;
  string f;
  ostringstream msg;
  char num [100];
  allocator local_261;
  cmLocalGenerator *local_260;
  long *local_258;
  long local_250;
  long local_248 [2];
  undefined1 local_238 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228 [6];
  ios_base local_1c8 [272];
  allocator local_b8 [112];
  Snapshot local_48;
  
  this->FirstTimeProgress = 0.0;
  ClearGeneratorMembers(this);
  cmState::Snapshot::Snapshot(&local_48,(cmState *)0x0,(PositionType)ZEXT816(0));
  local_228[0]._M_allocated_capacity = local_48.Position.Position;
  local_238._0_8_ = local_48.State;
  local_238._8_8_ = local_48.Position.Tree;
  bVar5 = cmState::Snapshot::IsValid((Snapshot *)local_238);
  if (!bVar5) {
    pcVar2 = this->CMakeInstance;
    local_228[0]._0_8_ = (pcVar2->CurrentSnapshot).Position.Position;
    local_238._0_8_ = (pcVar2->CurrentSnapshot).State;
    local_238._8_8_ = (pcVar2->CurrentSnapshot).Position.Tree;
  }
  iVar6 = (*this->_vptr_cmGlobalGenerator[0x22])(this,0);
  local_260 = (cmLocalGenerator *)CONCAT44(extraout_var,iVar6);
  __position._M_current =
       (this->LocalGenerators).
       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->LocalGenerators).
      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>>::
    _M_realloc_insert<cmLocalGenerator*const&>
              ((vector<cmLocalGenerator*,std::allocator<cmLocalGenerator*>> *)&this->LocalGenerators
               ,__position,&local_260);
  }
  else {
    *__position._M_current = local_260;
    pppcVar1 = &(this->LocalGenerators).
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  pcVar3 = local_260->Makefile;
  pcVar7 = cmake::GetHomeDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)local_238,pcVar7,local_b8);
  cmMakefile::SetCurrentSourceDirectory(pcVar3,(string *)local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._0_8_ != local_228) {
    operator_delete((void *)local_238._0_8_,local_228[0]._M_allocated_capacity + 1);
  }
  pcVar3 = local_260->Makefile;
  pcVar7 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)local_238,pcVar7,local_b8);
  cmMakefile::SetCurrentBinaryDirectory(pcVar3,(string *)local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._0_8_ != local_228) {
    operator_delete((void *)local_238._0_8_,local_228[0]._M_allocated_capacity + 1);
  }
  pcVar7 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
  std::__cxx11::string::string((string *)local_238,pcVar7,local_b8);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&this->BinaryDirectories,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._0_8_ != local_228) {
    operator_delete((void *)local_238._0_8_,local_228[0]._M_allocated_capacity + 1);
  }
  cmMakefile::Configure(local_260->Makefile);
  sprintf((char *)local_b8,"%d",
          (ulong)((long)(this->LocalGenerators).
                        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->LocalGenerators).
                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 3);
  pcVar2 = this->CMakeInstance;
  local_238._0_8_ = local_228;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_238,"CMAKE_NUMBER_OF_LOCAL_GENERATORS","");
  cmake::AddCacheEntry(pcVar2,(string *)local_238,(char *)local_b8,"number of local generators",4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._0_8_ != local_228) {
    operator_delete((void *)local_238._0_8_,local_228[0]._M_allocated_capacity + 1);
  }
  CheckLocalGenerators(this);
  FillProjectMap(this);
  if (this->CMakeInstance->CurrentWorkingMode == NORMAL_MODE) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    if (((cmSystemTools::s_ErrorOccured != false) || (cmSystemTools::s_FatalErrorOccured != false))
       || (bVar5 = cmSystemTools::GetInterruptFlag(), bVar5)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,"Configuring incomplete, errors occurred!",0x28);
      ppuVar9 = &PTR_anon_var_dwarf_f5972_005b38e8;
      do {
        pcVar7 = cmake::GetHomeOutputDirectory(this->CMakeInstance);
        std::__cxx11::string::string((string *)&local_258,pcVar7,&local_261);
        std::__cxx11::string::append((char *)&local_258);
        std::__cxx11::string::append((char *)&local_258);
        std::__cxx11::string::append((char *)&local_258);
        bVar5 = cmsys::SystemTools::FileExists((char *)local_258);
        if (bVar5) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_238,"\nSee also \"",0xb);
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_238,(char *)local_258,local_250);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\".",2);
        }
        if (local_258 != local_248) {
          operator_delete(local_258,local_248[0] + 1);
        }
        puVar4 = *ppuVar9;
        ppuVar9 = ppuVar9 + 1;
      } while (puVar4 != (undefined *)0x0);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,"Configuring done",0x10);
    }
    pcVar2 = this->CMakeInstance;
    std::__cxx11::stringbuf::str();
    cmake::UpdateProgress(pcVar2,(char *)local_258,-1.0);
    if (local_258 != local_248) {
      operator_delete(local_258,local_248[0] + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    std::ios_base::~ios_base(local_1c8);
    return;
  }
  return;
}

Assistant:

void cmGlobalGenerator::Configure()
{
  this->FirstTimeProgress = 0.0f;
  this->ClearGeneratorMembers();

  // start with this directory
  cmLocalGenerator *lg = this->MakeLocalGenerator();
  this->LocalGenerators.push_back(lg);

  // set the Start directories
  lg->GetMakefile()->SetCurrentSourceDirectory
    (this->CMakeInstance->GetHomeDirectory());
  lg->GetMakefile()->SetCurrentBinaryDirectory
    (this->CMakeInstance->GetHomeOutputDirectory());

  this->BinaryDirectories.insert(
      this->CMakeInstance->GetHomeOutputDirectory());

  // now do it
  lg->GetMakefile()->Configure();

  // update the cache entry for the number of local generators, this is used
  // for progress
  char num[100];
  sprintf(num,"%d",static_cast<int>(this->LocalGenerators.size()));
  this->GetCMakeInstance()->AddCacheEntry
    ("CMAKE_NUMBER_OF_LOCAL_GENERATORS", num,
     "number of local generators", cmState::INTERNAL);

  // check for link libraries and include directories containing "NOTFOUND"
  // and for infinite loops
  this->CheckLocalGenerators();

  // at this point this->LocalGenerators has been filled,
  // so create the map from project name to vector of local generators
  this->FillProjectMap();

  if ( this->CMakeInstance->GetWorkingMode() == cmake::NORMAL_MODE)
    {
    std::ostringstream msg;
    if(cmSystemTools::GetErrorOccuredFlag())
      {
      msg << "Configuring incomplete, errors occurred!";
      const char* logs[] = {"CMakeOutput.log", "CMakeError.log", 0};
      for(const char** log = logs; *log; ++log)
        {
        std::string f = this->CMakeInstance->GetHomeOutputDirectory();
        f += this->CMakeInstance->GetCMakeFilesDirectory();
        f += "/";
        f += *log;
        if(cmSystemTools::FileExists(f.c_str()))
          {
          msg << "\nSee also \"" << f << "\".";
          }
        }
      }
    else
      {
      msg << "Configuring done";
      }
    this->CMakeInstance->UpdateProgress(msg.str().c_str(), -1);
    }
}